

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GenUnPackForStruct
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  IdlNamer *this_00;
  Value *type;
  string package_reference;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string field_type;
  string field_method;
  string struct_var;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string field_field;
  
  this_00 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[7])(&struct_var,this_00,struct_def);
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(&field_field,this_00,field);
  (*(this_00->super_Namer)._vptr_Namer[4])(&field_method,this_00,field);
  type = &field->value;
  GenTypeGet_abi_cxx11_(&field_type,this,&type->type);
  if ((((this->super_BaseGenerator).parser_)->opts).include_dependence_headers == true) {
    GenPackageReference_abi_cxx11_(&package_reference,this,&type->type);
    std::operator+(&local_1d0,&package_reference,".");
    GenTypeGet_abi_cxx11_(&local_1f0,this,&type->type);
    std::operator+(&local_1b0,&local_1d0,&local_1f0);
    std::__cxx11::string::operator=((string *)&field_type,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&package_reference);
  }
  GenIndents_abi_cxx11_(&local_190,this,2);
  std::operator+(&local_170,&local_190,"if ");
  std::operator+(&local_1f0,&local_170,&struct_var);
  std::operator+(&local_1d0,&local_1f0,".");
  std::operator+(&local_1b0,&local_1d0,&field_method);
  std::operator+(&package_reference,&local_1b0,"(");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&package_reference);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  if ((struct_def->fixed == true) && ((type->type).base_type == BASE_TYPE_STRUCT)) {
    std::operator+(&package_reference,&field_type,"()");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&package_reference);
  }
  std::__cxx11::string::append((char *)code_ptr);
  GenIndents_abi_cxx11_(&local_d0,this,3);
  std::operator+(&local_b0,&local_d0,"self.");
  std::operator+(&local_90,&local_b0,&field_field);
  std::operator+(&local_70,&local_90," = ");
  Namer::ObjectType(&local_f0,&this_00->super_Namer,&field_type);
  std::operator+(&local_190,&local_70,&local_f0);
  std::operator+(&local_170,&local_190,".InitFromObj(");
  std::operator+(&local_1f0,&local_170,&struct_var);
  std::operator+(&local_1d0,&local_1f0,".");
  std::operator+(&local_1b0,&local_1d0,&field_method);
  std::operator+(&package_reference,&local_1b0,"(");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&package_reference);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  if ((struct_def->fixed == true) && ((type->type).base_type == BASE_TYPE_STRUCT)) {
    std::operator+(&package_reference,&field_type,"()");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&package_reference);
  }
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::~string((string *)&field_type);
  std::__cxx11::string::~string((string *)&field_method);
  std::__cxx11::string::~string((string *)&field_field);
  std::__cxx11::string::~string((string *)&struct_var);
  return;
}

Assistant:

void GenUnPackForStruct(const StructDef &struct_def, const FieldDef &field,
                          std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto struct_var = namer_.Variable(struct_def);
    const auto field_field = namer_.Field(field);
    const auto field_method = namer_.Method(field);
    auto field_type = TypeName(field);

    if (parser_.opts.include_dependence_headers) {
      auto package_reference = GenPackageReference(field.value.type);
      field_type = package_reference + "." + TypeName(field);
    }

    code += GenIndents(2) + "if " + struct_var + "." + field_method + "(";
    // if field is a struct, we need to create an instance for it first.
    if (struct_def.fixed && field.value.type.base_type == BASE_TYPE_STRUCT) {
      code += field_type + "()";
    }
    code += ") is not None:";
    code += GenIndents(3) + "self." + field_field + " = " +
            namer_.ObjectType(field_type) + +".InitFromObj(" + struct_var +
            "." + field_method + "(";
    // A struct's accessor requires a struct buf instance.
    if (struct_def.fixed && field.value.type.base_type == BASE_TYPE_STRUCT) {
      code += field_type + "()";
    }
    code += "))";
  }